

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::GradX<double>
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,TPZFMatrix<double> *coord,
          TPZVec<double> *xiInterior,TPZFMatrix<double> *gradx)

{
  double dVar1;
  bool bVar2;
  MElementType elType;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  undefined4 extraout_var;
  int iNode;
  long lVar6;
  int xi;
  long lVar7;
  ulong uVar8;
  TPZFMatrix<double> *pTVar9;
  int x;
  long lVar10;
  int i_2;
  double dVar11;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *this_00;
  int j;
  TPZFMatrix<double> *pTVar12;
  int side;
  double local_1400;
  double local_13f8;
  long local_13f0;
  int subSide;
  TPZVec<double> *local_13e0;
  TPZFMatrix<double> *local_13d8;
  TPZFMatrix<double> *local_13d0;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *local_13c8;
  TPZGeoMesh *local_13c0;
  TPZFMatrix<double> *local_13b8;
  double blendFactorSide;
  TPZGeoElSideIndex *local_13a8;
  double local_13a0;
  TPZGeoElSide gelside;
  TPZVec<TPZFMatrix<double>_> gradLinSideVec;
  TPZVec<TPZFMatrix<double>_> gradNonLinSideVec;
  TPZManVector<double,_3> neighXi_1;
  TPZManVector<double,_3> nodeCoord;
  TPZManVector<double,_3> dCorrFactorSideDxiProj;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> sideXi;
  TPZManVector<double,_3> xiProjectedOverSide;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  TPZFNMatrix<27,_double> dCorrFactorDxi;
  TPZFNMatrix<9,_double> transfXiToSideXi;
  TPZFNMatrix<9,_double> dNeighXiDXi_1;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<3,_double> dCorrFactorSideDxi;
  TPZFNMatrix<9,_double> gradLinSideXiSide;
  TPZManVector<double,_20> blendFactor;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZFNMatrix<9,_double> gradNeigh_1;
  TPZFNMatrix<9,_double> dXiProjectedOverSideDxi;
  TPZFNMatrix<9,_double> sidePhiVec;
  TPZFNMatrix<3,_double> dCorrFactorSideDxiProjMat;
  TPZFNMatrix<9,_double> dXprojDxiSide;
  TPZFNMatrix<9,_double> dSidePhiDSideXiVec;
  TPZFNMatrix<9,_double> dPhiDxi;
  TPZFNMatrix<45,_double> gradXLin;
  TPZFNMatrix<9,_double> phi;
  
  local_13c0 = this->fGeoEl->fMesh;
  local_13e0 = xiInterior;
  local_13d8 = gradx;
  (*(gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (gradx,3,2);
  if (this->fNeighbours[4].fGeoElIndex == -1) {
    TPZFNMatrix<9,_double>::TPZFNMatrix(&phi,4,1);
    TPZFNMatrix<9,_double>::TPZFNMatrix(&dPhiDxi,2,4);
    pztopology::TPZQuadrilateral::TShape<double>
              (local_13e0,&phi.super_TPZFMatrix<double>,&dPhiDxi.super_TPZFMatrix<double>);
    dCorrFactorDxi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<45,_double>::TPZFNMatrix(&gradXLin,3,2,(double *)&dCorrFactorDxi);
    local_13a8 = this->fNeighbours;
    local_13c8 = this;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()(coord,lVar10,lVar6);
          dVar11 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()(&dPhiDxi.super_TPZFMatrix<double>,lVar7,lVar6);
          local_1400 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()(&gradXLin.super_TPZFMatrix<double>,lVar10,lVar7);
          *pdVar5 = dVar11 * local_1400 + *pdVar5;
        }
      }
    }
    for (lVar6 = 0; lVar6 < (local_13d8->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar6 = lVar6 + 1) {
      for (lVar10 = 0; lVar10 < (local_13d8->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
          lVar10 = lVar10 + 1) {
        pdVar5 = TPZFMatrix<double>::operator()(&gradXLin.super_TPZFMatrix<double>,lVar6,lVar10);
        dVar11 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()(local_13d8,lVar6,lVar10);
        *pdVar5 = dVar11;
      }
    }
    linearSideMappings.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&dCorrFactorDxi,3,2,(double *)&linearSideMappings);
    TPZVec<TPZFMatrix<double>_>::TPZVec
              (&gradNonLinSideVec,5,&dCorrFactorDxi.super_TPZFMatrix<double>);
    this_00 = local_13c8;
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&dCorrFactorDxi);
    linearSideMappings.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&dCorrFactorDxi,3,2,(double *)&linearSideMappings);
    TPZVec<TPZFMatrix<double>_>::TPZVec(&gradLinSideVec,5,&dCorrFactorDxi.super_TPZFMatrix<double>);
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&dCorrFactorDxi);
    dCorrFactorDxi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZManVector<double,_20>::TPZManVector(&blendFactor,5,(double *)&dCorrFactorDxi);
    linearSideMappings.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&dCorrFactorDxi,5,2,(double *)&linearSideMappings);
    nonLinearSideMappings.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&linearSideMappings,5,3,(double *)&nonLinearSideMappings);
    transfXiToSideXi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<27,_double>::TPZFNMatrix(&nonLinearSideMappings,5,3,(double *)&transfXiToSideXi);
    lVar6 = 0;
    while( true ) {
      if (lVar6 == 4) break;
      transfXiToSideXi.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
      local_13f0 = lVar6;
      TPZManVector<double,_3>::TPZManVector(&xiProjectedOverSide,2,(double *)&transfXiToSideXi);
      pTVar12 = gradNonLinSideVec.fStore + local_13f0;
      local_13b8 = gradLinSideVec.fStore + local_13f0;
      (*gradLinSideVec.fStore[local_13f0].super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0xe])(local_13b8,3,2);
      (*(pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xe])(pTVar12,3,2);
      side = (uint)local_13f0 | 4;
      local_13d0 = pTVar12;
      TPZGeoElSide::TPZGeoElSide(&gelside,local_13a8 + local_13f0,local_13c0);
      bVar2 = IsLinearMapping(this_00,side);
      if (((bVar2) || (gelside.fGeoEl == (TPZGeoEl *)0x0)) || (gelside.fSide < 0)) {
        blendFactor.super_TPZVec<double>.fStore[local_13f0] = 0.0;
      }
      else {
        TPZManVector<double,_3>::TPZManVector(&sideXi,0);
        TPZFNMatrix<9,_double>::TPZFNMatrix(&transfXiToSideXi);
        bVar2 = pztopology::TPZQuadrilateral::CheckProjectionForSingularity<double>
                          (&side,local_13e0);
        if (bVar2) {
          pztopology::TPZQuadrilateral::MapToSide<double>
                    (side,local_13e0,&sideXi.super_TPZVec<double>,
                     &transfXiToSideXi.super_TPZFMatrix<double>);
          elType = pztopology::TPZQuadrilateral::Type(side);
          iVar3 = MElementType_NNodes(elType);
          local_13f8 = (double)CONCAT44(extraout_var,iVar3);
          uVar4 = pztopology::TPZQuadrilateral::SideDimension(side);
          lVar10 = (long)local_13f8._0_4_;
          TPZFNMatrix<9,_double>::TPZFNMatrix(&sidePhiVec,lVar10,1);
          lVar6 = (long)(int)uVar4;
          TPZFNMatrix<9,_double>::TPZFNMatrix(&dSidePhiDSideXiVec,lVar6,lVar10);
          GetSideShapeFunction<pzgeom::TPZGeoQuad>
                    (side,&sideXi.super_TPZVec<double>,&sidePhiVec.super_TPZFMatrix<double>,
                     &dSidePhiDSideXiVec.super_TPZFMatrix<double>);
          dXiProjectedOverSideDxi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    (&dXprojDxiSide,2,lVar6,(double *)&dXiProjectedOverSideDxi);
          gradLinSideXiSide.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    (&dXiProjectedOverSideDxi,2,2,(double *)&gradLinSideXiSide);
          TPZManVector<double,_3>::TPZManVector(&nodeCoord,0);
          dNeighXiDXi_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          TPZFNMatrix<9,_double>::TPZFNMatrix(&gradLinSideXiSide,3,lVar6,(double *)&dNeighXiDXi_1);
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          iVar3 = SUB84(local_13f8,0);
          local_13f8 = (double)((ulong)local_13f8 & 0xffffffff);
          if (iVar3 < 1) {
            local_13f8 = 0.0;
          }
          for (dVar11 = 0.0; dVar11 != local_13f8; dVar11 = (double)((long)dVar11 + 1)) {
            iVar3 = pztopology::TPZQuadrilateral::SideNodeLocId(side,SUB84(dVar11,0));
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              pdVar5 = TPZFMatrix<double>::operator()(coord,lVar6,(long)iVar3);
              dVar1 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&sidePhiVec.super_TPZFMatrix<double>,(int64_t)dVar11,0);
              local_1400 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&linearSideMappings.super_TPZFMatrix<double>,local_13f0,lVar6);
              *pdVar5 = dVar1 * local_1400 + *pdVar5;
            }
            pztopology::TPZQuadrilateral::ParametricDomainNodeCoord
                      (iVar3,&nodeCoord.super_TPZVec<double>);
            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
              dVar1 = nodeCoord.super_TPZVec<double>.fStore[lVar6];
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&sidePhiVec.super_TPZFMatrix<double>,(int64_t)dVar11,0);
              xiProjectedOverSide.super_TPZVec<double>.fStore[lVar6] =
                   dVar1 * *pdVar5 + xiProjectedOverSide.super_TPZVec<double>.fStore[lVar6];
            }
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
                pdVar5 = TPZFMatrix<double>::operator()(coord,lVar6,(long)iVar3);
                dVar1 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&dSidePhiDSideXiVec.super_TPZFMatrix<double>,uVar8,
                                    (int64_t)dVar11);
                local_1400 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&gradLinSideXiSide.super_TPZFMatrix<double>,lVar6,uVar8);
                *pdVar5 = dVar1 * local_1400 + *pdVar5;
              }
            }
            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
              for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
                dVar1 = nodeCoord.super_TPZVec<double>.fStore[lVar6];
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&dSidePhiDSideXiVec.super_TPZFMatrix<double>,uVar8,
                                    (int64_t)dVar11);
                local_1400 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&dXprojDxiSide.super_TPZFMatrix<double>,lVar6,uVar8);
                *pdVar5 = dVar1 * local_1400 + *pdVar5;
              }
            }
          }
          TPZMatrix<double>::Multiply
                    ((TPZMatrix<double> *)&gradLinSideXiSide,
                     &transfXiToSideXi.super_TPZFMatrix<double>,local_13b8,0);
          TPZMatrix<double>::Multiply
                    ((TPZMatrix<double> *)&dXprojDxiSide,&transfXiToSideXi.super_TPZFMatrix<double>,
                     &dXiProjectedOverSideDxi.super_TPZFMatrix<double>,0);
          gradNeigh_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)&dNeighXiDXi_1,2,(double *)&gradNeigh_1);
          this_00 = local_13c8;
          pztopology::TPZQuadrilateral::BlendFactorForSide<double>
                    (&side,local_13e0,blendFactor.super_TPZVec<double>.fStore + local_13f0,
                     (TPZVec<double> *)&dNeighXiDXi_1);
          pTVar12 = local_13b8;
          for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
            dVar11 = *(double *)
                      (dNeighXiDXi_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                       super_TPZBaseMatrix.fRow + lVar6 * 8);
            pdVar5 = TPZFMatrix<double>::operator()
                               (&dCorrFactorDxi.super_TPZFMatrix<double>,local_13f0,lVar6);
            *pdVar5 = dVar11;
          }
          TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&dNeighXiDXi_1);
          iVar3 = TPZGeoElSide::Dimension(&gelside);
          TPZManVector<double,_3>::TPZManVector(&neighXi_1,0);
          TPZFNMatrix<9,_double>::TPZFNMatrix(&dNeighXiDXi_1);
          bVar2 = MapToNeighSide<double>
                            (this_00,side,iVar3,local_13e0,&neighXi_1.super_TPZVec<double>,
                             &dNeighXiDXi_1.super_TPZFMatrix<double>);
          if (bVar2) {
            gradNeigh_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
            TPZManVector<double,_3>::TPZManVector(&Xside,3,(double *)&gradNeigh_1);
            Neighbour((TPZGeoElSide *)&gradNeigh_1,this_00,side,local_13c0);
            TPZGeoElSide::X((TPZGeoElSide *)&gradNeigh_1,&neighXi_1.super_TPZVec<double>,
                            &Xside.super_TPZVec<double>);
            TPZFNMatrix<9,_double>::TPZFNMatrix(&gradNeigh_1);
            Neighbour((TPZGeoElSide *)&dCorrFactorSideDxi,this_00,side,local_13c0);
            TPZGeoElSide::GradX((TPZGeoElSide *)&dCorrFactorSideDxi,&neighXi_1.super_TPZVec<double>,
                                &gradNeigh_1.super_TPZFMatrix<double>);
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              dVar11 = Xside.super_TPZVec<double>.fStore[lVar6];
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&nonLinearSideMappings.super_TPZFMatrix<double>,local_13f0,lVar6);
              *pdVar5 = dVar11;
            }
            TPZMatrix<double>::Multiply
                      ((TPZMatrix<double> *)&gradNeigh_1,&dNeighXiDXi_1.super_TPZFMatrix<double>,
                       local_13d0,0);
            TPZStack<int,_10>::TPZStack(&containedNodesInSide);
            pztopology::TPZQuadrilateral::LowerDimensionSides(side,&containedNodesInSide,0);
            TPZStack<int,_10>::TPZStack(&allContainedSides);
            pztopology::TPZQuadrilateral::LowerDimensionSides(side,&allContainedSides);
            lVar6 = (long)(int)containedNodesInSide.super_TPZManVector<int,_10>.super_TPZVec<int>.
                               fNElements;
            while( true ) {
              if (allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements <=
                  lVar6) break;
              subSide = allContainedSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                        [lVar6];
              bVar2 = IsLinearMapping(this_00,subSide);
              if (!bVar2) {
                blendFactorSide = -1.0;
                dCorrFactorSideDxi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
                TPZManVector<double,_3>::TPZManVector
                          (&dCorrFactorSideDxiProj,2,(double *)&dCorrFactorSideDxi);
                dCorrFactorSideDxiProjMat.super_TPZFMatrix<double>.super_TPZMatrix<double>.
                super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
                TPZFNMatrix<3,_double>::TPZFNMatrix
                          (&dCorrFactorSideDxi,2,1,(double *)&dCorrFactorSideDxiProjMat);
                pztopology::TPZQuadrilateral::BlendFactorForSide<double>
                          (&subSide,&xiProjectedOverSide.super_TPZVec<double>,&blendFactorSide,
                           &dCorrFactorSideDxiProj.super_TPZVec<double>);
                local_13a0 = 0.0;
                TPZFNMatrix<3,_double>::TPZFNMatrix(&dCorrFactorSideDxiProjMat,1,2,&local_13a0);
                for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                  dVar11 = dCorrFactorSideDxiProj.super_TPZVec<double>.fStore[lVar10];
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&dCorrFactorSideDxiProjMat.super_TPZFMatrix<double>,0,lVar10);
                  *pdVar5 = dVar11;
                }
                TPZMatrix<double>::Multiply
                          ((TPZMatrix<double> *)&dCorrFactorSideDxiProjMat,
                           &dXiProjectedOverSideDxi.super_TPZFMatrix<double>,
                           &dCorrFactorSideDxi.super_TPZFMatrix<double>,0);
                pTVar9 = gradNonLinSideVec.fStore + (long)subSide + -4;
                pTVar12 = gradLinSideVec.fStore + (long)subSide + -4;
                for (lVar10 = 0; dVar11 = blendFactorSide, lVar10 != 3; lVar10 = lVar10 + 1) {
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&nonLinearSideMappings.super_TPZFMatrix<double>,
                                      (long)subSide + -4,lVar10);
                  local_1400 = *pdVar5;
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&linearSideMappings.super_TPZFMatrix<double>,
                                      (long)subSide + -4,lVar10);
                  local_13f8 = *pdVar5;
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&nonLinearSideMappings.super_TPZFMatrix<double>,local_13f0,
                                      lVar10);
                  *pdVar5 = *pdVar5 - dVar11 * (local_1400 - local_13f8);
                  for (lVar7 = 0; dVar11 = blendFactorSide, lVar7 != 2; lVar7 = lVar7 + 1) {
                    pdVar5 = TPZFMatrix<double>::operator()(pTVar9,lVar10,lVar7);
                    local_1400 = *pdVar5;
                    pdVar5 = TPZFMatrix<double>::operator()(pTVar12,lVar10,lVar7);
                    local_13f8 = *pdVar5;
                    pdVar5 = TPZFMatrix<double>::operator()(local_13d0,lVar10,lVar7);
                    *pdVar5 = *pdVar5 - dVar11 * (local_1400 - local_13f8);
                    pdVar5 = TPZFMatrix<double>::operator()
                                       (&dCorrFactorSideDxi.super_TPZFMatrix<double>,0,lVar7);
                    dVar11 = *pdVar5;
                    pdVar5 = TPZFMatrix<double>::operator()
                                       (&nonLinearSideMappings.super_TPZFMatrix<double>,
                                        (long)subSide + -4,lVar10);
                    local_1400 = *pdVar5;
                    pdVar5 = TPZFMatrix<double>::operator()
                                       (&linearSideMappings.super_TPZFMatrix<double>,
                                        (long)subSide + -4,lVar10);
                    local_13f8 = *pdVar5;
                    pdVar5 = TPZFMatrix<double>::operator()(local_13d0,lVar10,lVar7);
                    *pdVar5 = *pdVar5 - dVar11 * (local_1400 - local_13f8);
                  }
                }
                TPZFNMatrix<3,_double>::~TPZFNMatrix(&dCorrFactorSideDxiProjMat);
                TPZFNMatrix<3,_double>::~TPZFNMatrix(&dCorrFactorSideDxi);
                TPZManVector<double,_3>::~TPZManVector(&dCorrFactorSideDxiProj);
                this_00 = local_13c8;
                pTVar12 = local_13b8;
              }
              lVar6 = lVar6 + 1;
            }
            pTVar9 = local_13d0;
            for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
              for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
                dVar11 = blendFactor.super_TPZVec<double>.fStore[local_13f0];
                pdVar5 = TPZFMatrix<double>::operator()(pTVar9,lVar6,lVar10);
                local_1400 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()(pTVar12,lVar6,lVar10);
                local_13f8 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()(local_13d8,lVar6,lVar10);
                *pdVar5 = dVar11 * (local_1400 - local_13f8) + *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&dCorrFactorDxi.super_TPZFMatrix<double>,local_13f0,lVar10);
                dVar11 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&nonLinearSideMappings.super_TPZFMatrix<double>,local_13f0,lVar6
                                   );
                local_1400 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()
                                   (&linearSideMappings.super_TPZFMatrix<double>,local_13f0,lVar6);
                local_13f8 = *pdVar5;
                pdVar5 = TPZFMatrix<double>::operator()(local_13d8,lVar6,lVar10);
                *pdVar5 = dVar11 * (local_1400 - local_13f8) + *pdVar5;
                pTVar9 = local_13d0;
              }
            }
            TPZManVector<int,_10>::~TPZManVector(&allContainedSides.super_TPZManVector<int,_10>);
            TPZManVector<int,_10>::~TPZManVector(&containedNodesInSide.super_TPZManVector<int,_10>);
            TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradNeigh_1);
            TPZManVector<double,_3>::~TPZManVector(&Xside);
            this_00 = local_13c8;
          }
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&dNeighXiDXi_1);
          TPZManVector<double,_3>::~TPZManVector(&neighXi_1);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradLinSideXiSide);
          TPZManVector<double,_3>::~TPZManVector(&nodeCoord);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&dXiProjectedOverSideDxi);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&dXprojDxiSide);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&dSidePhiDSideXiVec);
          TPZFNMatrix<9,_double>::~TPZFNMatrix(&sidePhiVec);
        }
        TPZFNMatrix<9,_double>::~TPZFNMatrix(&transfXiToSideXi);
        TPZManVector<double,_3>::~TPZManVector(&sideXi);
      }
      lVar6 = local_13f0;
      TPZManVector<double,_3>::~TPZManVector(&xiProjectedOverSide);
      lVar6 = lVar6 + 1;
    }
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&nonLinearSideMappings);
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&linearSideMappings);
    TPZFNMatrix<27,_double>::~TPZFNMatrix(&dCorrFactorDxi);
    TPZManVector<double,_20>::~TPZManVector(&blendFactor);
    TPZVec<TPZFMatrix<double>_>::~TPZVec(&gradLinSideVec);
    TPZVec<TPZFMatrix<double>_>::~TPZVec(&gradNonLinSideVec);
    TPZFNMatrix<45,_double>::~TPZFNMatrix(&gradXLin);
    TPZFNMatrix<9,_double>::~TPZFNMatrix(&dPhiDxi);
    TPZFNMatrix<9,_double>::~TPZFNMatrix(&phi);
  }
  else {
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&linearSideMappings,0);
    TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)&gradXLin);
    bVar2 = MapToNeighSide<double>
                      (this,8,2,local_13e0,(TPZVec<double> *)&linearSideMappings,
                       &gradXLin.super_TPZFMatrix<double>);
    if (!bVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x80);
    }
    TPZFNMatrix<9,_double>::TPZFNMatrix((TPZFNMatrix<9,_double> *)&dCorrFactorDxi);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)&nonLinearSideMappings,this->fNeighbours + 4,local_13c0);
    TPZGeoElSide::GradX((TPZGeoElSide *)&nonLinearSideMappings,(TPZVec<double> *)&linearSideMappings
                        ,&dCorrFactorDxi.super_TPZFMatrix<double>);
    TPZMatrix<double>::Multiply
              ((TPZMatrix<double> *)&dCorrFactorDxi,&gradXLin.super_TPZFMatrix<double>,local_13d8,0)
    ;
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)&dCorrFactorDxi);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)&gradXLin);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&linearSideMappings);
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &xiInterior, TPZFMatrix<T> &gradx) const {

    TPZGeoEl &gel = *fGeoEl;
    TPZGeoMesh *gmesh = gel.Mesh();
#ifdef PZ_LOG
    const auto VAL_WIDTH = 10;
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {   soutLogDebug<<"======================_______REF_1"<<std::endl;
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::GradX"<<std::endl;
        soutLogDebug << "element id " <<gel.Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xiInterior.size(); i++) soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<xiInterior[i]<<"\t";
        soutLogDebug<<std::endl;
    }
#endif
    const REAL zero = 1e-14;
    gradx.Redim(3,TGeo::Dimension);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(TGeo::NSides-1, gmesh).GradX(neighXi, gradNeigh);
        gradNeigh.Multiply(dNeighXiDXi,gradx);//gradNonLinSide = gradNeigh.dNeighXiDXi
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1), dPhiDxi(TGeo::Dimension, TGeo::NNodes);
    TGeo::TShape(xiInterior, phi, dPhiDxi);//gets the barycentric coordinates


    TPZFNMatrix<45,T> gradXLin(3, TGeo::Dimension,(T)0);
    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for(int x = 0; x < 3; x++) {
            for (int xi = 0; xi < TGeo::Dimension; xi++) {
                gradXLin(x, xi) += coord(x, iNode) * dPhiDxi(xi, iNode);
            }
        }
    }
    for(int i = 0; i < gradx.Rows(); i++){
        for(int j = 0; j < gradx.Cols(); j++){
            gradx(i,j) = gradXLin(i,j);
        }
    }

#ifdef PZ_LOG
    soutLogDebug<<"FIRST TERM"<<std::endl;
    soutLogDebug << "gradient of linear mapping:\n";
    if (logger.isDebugEnabled()) {
        for (int i = 0; i < gradXLin.Rows(); i++) {
            for (int j = 0; j < gradXLin.Cols(); j++) {
                soutLogDebug << std::setw(VAL_WIDTH) << std::right << gradXLin(i, j);
                if (j != gradXLin.Cols() - 1) soutLogDebug << "\t";
            }
            soutLogDebug << std::endl;
        }
    }

#endif
    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */

    TPZVec<TPZFMatrix<T> > gradNonLinSideVec(TGeo::NSides - TGeo::NNodes,
                                             TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZVec<TPZFMatrix<T> > gradLinSideVec(TGeo::NSides - TGeo::NNodes,
                                          TPZFNMatrix<27,T>(3, TGeo::Dimension, 0));
    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, (T)0);
    TPZFNMatrix<27,T> dCorrFactorDxi(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, (T) 0);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        TPZManVector<T, 3> xiProjectedOverSide(TGeo::Dimension, 0);
        TPZFMatrix<T> &gradNonLinSide = gradNonLinSideVec[sideIndex];
        TPZFMatrix<T> &gradLinSide = gradLinSideVec[sideIndex];
        gradLinSide.Redim(3,TGeo::Dimension);
        gradNonLinSide.Redim(3,TGeo::Dimension);

        int side = TGeo::NNodes + sideIndex;
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "================================" << std::endl;
            soutLogDebug << "side: " << side << " is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                if (IsLinearMapping(side)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false (no gelside) " << std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "false (gelside exists) " << std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3> sideXi;
        TPZFNMatrix<9, T> transfXiToSideXi;
        bool regularMap = TGeo::CheckProjectionForSingularity(side, xiInterior);
        if (!regularMap) {
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }

        this->MapToSide(side, xiInterior, sideXi, transfXiToSideXi);
        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        const int sideDim = TGeo::SideDimension(side);
        TPZFNMatrix<9, T> sidePhiVec(nSideNodes, 1),
                dSidePhiDSideXiVec(sideDim, nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhiVec, dSidePhiDSideXiVec);

        TPZFNMatrix<9, T> dXprojDxiSide(TGeo::Dimension,sideDim,(T)0),
                dXiProjectedOverSideDxi(TGeo::Dimension,TGeo::Dimension,(T)0);
        TPZManVector<REAL, 3> nodeCoord;
        //calculation of transformation for the derivatives of sidephi
        
        TPZFNMatrix<9, T> gradLinSideXiSide(3,sideDim,(T)0);
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhiVec(iNode, 0);
            }

            TGeo::ParametricDomainNodeCoord(currentNode, nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                xiProjectedOverSide[x] += nodeCoord[x] * sidePhiVec(iNode, 0);
            }

            for(int x = 0; x < 3; x++){
                for(int xi = 0; xi < sideDim; xi++) {
                    gradLinSideXiSide(x,xi) += coord(x, currentNode) * dSidePhiDSideXiVec(xi,iNode);
                }
            }

            for (int i = 0; i < TGeo::Dimension; i++) {
                for (int j = 0; j < sideDim; j++) {
                    dXprojDxiSide(i,j) += nodeCoord[i] * dSidePhiDSideXiVec(j,iNode);
                }
            }

        }

        gradLinSideXiSide.Multiply(transfXiToSideXi,gradLinSide);//gradLinSideTemp = gradLinSideXiSide.transfXiToSideXi
        dXprojDxiSide.Multiply(transfXiToSideXi,dXiProjectedOverSideDxi);//dXprojDxiTemp = dXprojDxiSide.transfXiToSideXi

        #ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "xi projection over side: ";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug << xiProjectedOverSide[x] << "\t";
            soutLogDebug << "\nGrad of projected point to side:\n";
            for(int i = 0; i < dXiProjectedOverSideDxi.Rows(); i++){
                for(int j = 0; j < dXiProjectedOverSideDxi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dXiProjectedOverSideDxi(i,j);
                    if(j != dXiProjectedOverSideDxi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "xi projection in side domain:";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug << sideXi[x] << "\t";
            soutLogDebug << "\nTransformation from x side to xi interior:\n";
            for(int i = 0; i < transfXiToSideXi.Rows(); i++){
                for(int j = 0; j < transfXiToSideXi.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<transfXiToSideXi(i,j);
                    if(j != transfXiToSideXi.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl << "\nLinear mapping of projected point: ";
            for (int x = 0; x < 3; x++) soutLogDebug << linearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of linear mapping of point projected to side:\n";
            for(int i = 0; i < gradLinSide.Rows(); i++){
                for(int j = 0; j < gradLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradLinSide(i,j);
                    if(j != gradLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
        }
        #endif
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        {
            TPZManVector<T,3> dCorrFactor(TGeo::Dimension,(T)0);
            TGeo::BlendFactorForSide(side, xiInterior, blendFactor[sideIndex], dCorrFactor);
            for(int iXi = 0; iXi < TGeo::Dimension; iXi++){
                dCorrFactorDxi(sideIndex,iXi) = dCorrFactor[iXi];
            }
        }

        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        TPZFNMatrix<9, T> dNeighXiDXi;
        if (!MapToNeighSide(side, sidedim, xiInterior, neighXi, dNeighXiDXi)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        Neighbour(side, gmesh).X(neighXi, Xside);
        TPZFNMatrix<9, T> gradNeigh;
        Neighbour(side, gmesh).GradX(neighXi,gradNeigh);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }
        gradNeigh.Multiply(dNeighXiDXi,gradNonLinSide);//gradNonLinSide = gradNeigh.dNeighXiDXi

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
//            TPZFNMatrix<9, T> gradNonLinSubSide(3,TGeo::Dimension,(T)0);
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if (IsLinearMapping(subSide)) continue;

            T blendFactorSide = -1;
            TPZManVector<T,3> dCorrFactorSideDxiProj(TGeo::Dimension,(T)0);
            TPZFNMatrix<3, T> dCorrFactorSideDxi(TGeo::Dimension,1,(T)0);
            TGeo::BlendFactorForSide(subSide, xiProjectedOverSide, blendFactorSide, dCorrFactorSideDxiProj);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            TPZFNMatrix<3, T> dCorrFactorSideDxiProjMat(1,TGeo::Dimension,(T)0);
            for(int xi = 0; xi < TGeo::Dimension; xi++){
                dCorrFactorSideDxiProjMat(0,xi) = dCorrFactorSideDxiProj[xi];
            }

//                 dCorrFactorSideDxi = dXiProjectedOverSideDxi. dCorrFactorSideDxiProjMat
//                dXiProjectedOverSideDxi.Multiply(dCorrFactorSideDxiProjMat,dCorrFactorSideDxi);//mostrarphil

//                dCorrFactorSideDxi = dCorrFactorSideDxiProjMat . dXiProjectedOverSideDxi;
            dCorrFactorSideDxiProjMat.Multiply(dXiProjectedOverSideDxi,dCorrFactorSideDxi);
            #ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\n\tGrad of correction factor of point projected to side:\n";
                for(int i = 0; i < dCorrFactorSideDxi.Rows(); i++){
                    soutLogDebug<<"\t";
                    for(int j = 0; j < dCorrFactorSideDxi.Cols(); j++){
                        soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<dCorrFactorSideDxi(i,j);
                        if(j != dCorrFactorSideDxi.Cols() - 1) soutLogDebug<<"\t";
                    }
                    soutLogDebug<<std::endl;
                }
            }
            #endif
            TPZFMatrix<T> &gradNonLinSubSide = gradNonLinSideVec[subSide - TGeo::NNodes];
            TPZFMatrix<T> &gradLinSubSide = gradLinSideVec[subSide - TGeo::NNodes];
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
                for (int j = 0; j < TGeo::Dimension; j++) {
                    gradNonLinSide(x,j) -= blendFactorSide *  (gradNonLinSubSide(x,j)-gradLinSubSide(x,j));
                    gradNonLinSide(x,j) -= dCorrFactorSideDxi(0,j) *
                                           (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                                            linearSideMappings(subSide - TGeo::NNodes, x));
                }
            }
        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping: ";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\t";
            soutLogDebug << "\nGrad of non-linear mapping:\n";
            for(int i = 0; i < gradNonLinSide.Rows(); i++){
                for(int j = 0; j < gradNonLinSide.Cols(); j++){
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradNonLinSide(i,j);
                    if(j != gradNonLinSide.Cols() - 1) soutLogDebug<<"\t";
                }
                soutLogDebug<<std::endl;
            }
            soutLogDebug << std::endl;
            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tcorrection factor: " << blendFactor[sideIndex] << std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi: ";
            for(int i = 0; i < TGeo::Dimension; i++) soutLogDebug<<dCorrFactorDxi(sideIndex,i)<<"\t";
            soutLogDebug << "\n";

            soutLogDebug<<"SECOND TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tblendFactor *  (gradNonLinSide-gradLinSide): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }
            soutLogDebug<<"THIRD TERM (SIDE "<<sideIndex<<") :"<<std::endl;
            soutLogDebug << "\t\tdCorrFactorDxi *\n"
                            "                              (nonLinearSideMappings -\n"
                            "                               linearSideMappings): " << std::endl;
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < TGeo::Dimension; j++) {
                    const T val = dCorrFactorDxi(sideIndex,j) *
                                  (nonLinearSideMappings(sideIndex, i) -
                                   linearSideMappings(sideIndex,i));
                    soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<val;
                    if(j != TGeo::Dimension - 1) soutLogDebug<<"\t";
                }
                soutLogDebug << "\n";
            }

            soutLogDebug<<std::endl;
        }
#endif

        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < TGeo::Dimension; j++) {
                gradx(i,j) += blendFactor[sideIndex] *  (gradNonLinSide(i,j)-gradLinSide(i,j));
                gradx(i,j) += dCorrFactorDxi(sideIndex,j) *
                              (nonLinearSideMappings(sideIndex, i) -
                               linearSideMappings(sideIndex,i));
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for(int i = 0; i < gradx.Rows(); i++){
            for(int j = 0; j < gradx.Cols(); j++){
                soutLogDebug<<std::setw(VAL_WIDTH) << std::right<<gradx(i,j);
                if(j != gradx.Cols() - 1) soutLogDebug<<"\t";
            }
            soutLogDebug<<std::endl;
        }
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
#ifdef PZDEBUG
    for(int i = 0; i < gradx.Rows();i++){
        for(int j = 0; j < gradx.Cols(); j++) {
            if (std::isnan(TPZExtractVal::val(gradx(i,j)))) {
                DebugStop();
            }
        }
    }
#endif

}